

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::WriteValue<duckdb::ColumnDefinition>
          (Serializer *this,vector<duckdb::ColumnDefinition,_true> *vec)

{
  pointer pCVar1;
  ColumnDefinition *item;
  pointer this_00;
  
  (*this->_vptr_Serializer[8])
            (this,((long)(vec->
                         super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                         ).
                         super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(vec->
                         super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                         ).
                         super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
  pCVar1 = (vec->super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
           super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (vec->
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1
      ) {
    (*this->_vptr_Serializer[6])(this);
    ColumnDefinition::Serialize(this_00,this);
    (*this->_vptr_Serializer[7])(this);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}